

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int defragmentPage(MemPage *pPage)

{
  ushort uVar1;
  ushort uVar2;
  u32 uVar3;
  u8 *puVar4;
  u16 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  void *pvVar11;
  u8 *puVar12;
  u8 *pAddr;
  int iCellLast;
  int iCellFirst;
  uchar *temp;
  uchar *data;
  int nCell;
  int cbrk;
  int cellOffset;
  int usableSize;
  int size;
  int hdr;
  int pc;
  int i;
  MemPage *pPage_local;
  
  pvVar11 = sqlite3PagerTempSpace(pPage->pBt->pPager);
  puVar4 = pPage->aData;
  uVar6 = (uint)pPage->hdrOffset;
  uVar1 = pPage->cellOffset;
  uVar2 = pPage->nCell;
  uVar3 = pPage->pBt->usableSize;
  uVar7 = (uint)CONCAT11(puVar4[(int)(uVar6 + 5)],puVar4[(long)(int)(uVar6 + 5) + 1]);
  memcpy((void *)((long)pvVar11 + (long)(int)uVar7),puVar4 + (int)uVar7,(long)(int)(uVar3 - uVar7));
  uVar7 = (uint)uVar1 + (uint)uVar2 * 2;
  hdr = 0;
  data._4_4_ = uVar3;
  while( true ) {
    if ((int)(uint)uVar2 <= hdr) {
      puVar4[(int)(uVar6 + 5)] = (u8)(data._4_4_ >> 8);
      puVar4[(long)(int)(uVar6 + 5) + 1] = (u8)data._4_4_;
      puVar4[(int)(uVar6 + 1)] = '\0';
      puVar4[(int)(uVar6 + 2)] = '\0';
      puVar4[(int)(uVar6 + 7)] = '\0';
      memset(puVar4 + (int)uVar7,0,(long)(int)(data._4_4_ - uVar7));
      if (data._4_4_ - uVar7 == (uint)pPage->nFree) {
        pPage_local._4_4_ = 0;
      }
      else {
        pPage_local._4_4_ = sqlite3CorruptError(0xc617);
      }
      return pPage_local._4_4_;
    }
    puVar12 = puVar4 + (int)((uint)uVar1 + hdr * 2);
    uVar8 = (uint)CONCAT11(*puVar12,puVar12[1]);
    if ((uVar8 < uVar7) || ((int)(uVar3 - 4) < (int)uVar8)) break;
    uVar5 = cellSizePtr(pPage,(u8 *)((long)pvVar11 + (long)(int)uVar8));
    uVar10 = (uint)uVar5;
    data._4_4_ = data._4_4_ - uVar10;
    if (((int)data._4_4_ < (int)uVar7) || ((int)uVar3 < (int)(uVar8 + uVar10))) {
      iVar9 = sqlite3CorruptError(0xc606);
      return iVar9;
    }
    memcpy(puVar4 + (int)data._4_4_,(void *)((long)pvVar11 + (long)(int)uVar8),(long)(int)uVar10);
    *puVar12 = (u8)(data._4_4_ >> 8);
    puVar12[1] = (u8)data._4_4_;
    hdr = hdr + 1;
  }
  iVar9 = sqlite3CorruptError(0xc5fa);
  return iVar9;
}

Assistant:

static int defragmentPage(MemPage *pPage){
  int i;                     /* Loop counter */
  int pc;                    /* Address of a i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */


  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) );
  usableSize = pPage->pBt->usableSize;
  cbrk = get2byte(&data[hdr+5]);
  memcpy(&temp[cbrk], &data[cbrk], usableSize - cbrk);
  cbrk = usableSize;
  iCellFirst = cellOffset + 2*nCell;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
#if !defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    /* These conditions have already been verified in btreeInitPage()
    ** if SQLITE_ENABLE_OVERSIZE_CELL_CHECK is defined 
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = cellSizePtr(pPage, &temp[pc]);
    cbrk -= size;
#if defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    if( cbrk<iCellFirst ){
      return SQLITE_CORRUPT_BKPT;
    }
#else
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    memcpy(&data[cbrk], &temp[pc], size);
    put2byte(pAddr, cbrk);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  data[hdr+7] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_BKPT;
  }
  return SQLITE_OK;
}